

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_struct.cpp
# Opt level: O2

bool duckdb::StructToUnionCast::Cast
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> _Var1;
  unsigned_long *puVar2;
  UnionInvalidReason UVar3;
  BoundCastData *pBVar4;
  FunctionLocalState *pFVar5;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference pvVar6;
  type pVVar7;
  type pVVar8;
  reference pvVar9;
  reference pvVar10;
  idx_t iVar11;
  SelectionVector *sel_p;
  ConversionException *pCVar12;
  InternalException *this_01;
  idx_t i;
  ulong __n;
  idx_t i_1;
  idx_t idx;
  bool bVar13;
  CastParameters child_parameters;
  UnifiedVectorFormat tag_data;
  
  pBVar4 = optional_ptr<duckdb::BoundCastData,_true>::operator->(&parameters->cast_data);
  pFVar5 = optional_ptr<duckdb::FunctionLocalState,_true>::operator->(&parameters->local_state);
  this = StructVector::GetEntries(source);
  this_00 = StructVector::GetEntries(result);
  for (__n = 0; __n < (ulong)((long)(this->
                                    super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->
                                    super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             ::get<true>(this_00,__n);
    pVVar7 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (pvVar6);
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             ::get<true>(this,__n);
    pVVar8 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (pvVar6);
    pvVar9 = vector<duckdb::BoundCastInfo,_true>::get<true>
                       ((vector<duckdb::BoundCastInfo,_true> *)(pBVar4 + 1),__n);
    _Var1._M_head_impl =
         (pvVar9->cast_data).
         super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
         super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
         .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
    pvVar10 = vector<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_true>
              ::get<true>((vector<duckdb::unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>,_true>
                           *)(pFVar5 + 1),__n);
    child_parameters.local_state.ptr =
         (pvVar10->
         super_unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionLocalState_*,_std::default_delete<duckdb::FunctionLocalState>_>
         .super__Head_base<0UL,_duckdb::FunctionLocalState_*,_false>._M_head_impl;
    child_parameters.strict = parameters->strict;
    child_parameters.error_message = parameters->error_message;
    child_parameters.query_location.index = (parameters->query_location).index;
    child_parameters.nullify_parent = false;
    child_parameters.cast_data.ptr = _Var1._M_head_impl;
    pvVar9 = vector<duckdb::BoundCastInfo,_true>::get<true>
                       ((vector<duckdb::BoundCastInfo,_true> *)(pBVar4 + 1),__n);
    (*pvVar9->function)(pVVar8,pVVar7,count,&child_parameters);
    Vector::Flatten(pVVar7,count);
  }
  if (source->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar2 = (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar2 == (unsigned_long *)0x0) {
      bVar13 = false;
    }
    else {
      bVar13 = (*puVar2 & 1) == 0;
    }
    ConstantVector::SetNull(result,bVar13);
    bVar13 = false;
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             ::get<true>(this_00,0);
    pVVar7 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (pvVar6);
    puVar2 = (pVVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar2 != (unsigned_long *)0x0) {
      bVar13 = (*puVar2 & 1) == 0;
    }
    ConstantVector::SetNull(result,bVar13);
  }
  else {
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             ::get<true>(this_00,0);
    pVVar7 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (pvVar6);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&child_parameters);
    UnifiedVectorFormat::UnifiedVectorFormat(&tag_data);
    Vector::ToUnifiedFormat(source,count,(UnifiedVectorFormat *)&child_parameters);
    Vector::ToUnifiedFormat(pVVar7,count,&tag_data);
    for (idx = 0; count != idx; idx = idx + 1) {
      iVar11 = idx;
      if ((child_parameters.cast_data.ptr)->_vptr_BoundCastData != (_func_int **)0x0) {
        iVar11 = (idx_t)*(uint *)((long)(child_parameters.cast_data.ptr)->_vptr_BoundCastData +
                                 idx * 4);
      }
      if ((child_parameters.error_message == (string *)0x0) ||
         (((ulong)(&(child_parameters.error_message)->_M_dataplus)[iVar11 >> 6]._M_p >>
           (iVar11 & 0x3f) & 1) != 0)) {
        iVar11 = idx;
        if ((tag_data.sel)->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)(tag_data.sel)->sel_vector[idx];
        }
        if ((tag_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
             (unsigned_long *)0x0) &&
           ((tag_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar11 >> 6]
             >> (iVar11 & 0x3f) & 1) == 0)) goto LAB_00a75b3d;
      }
      else {
LAB_00a75b3d:
        FlatVector::SetNull(result,idx,true);
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&tag_data);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&child_parameters);
  }
  sel_p = FlatVector::IncrementalSelectionVector();
  UVar3 = UnionVector::CheckUnionValidity(result,count,sel_p);
  switch(UVar3) {
  case VALID:
    Vector::Verify(result,count);
    return true;
  case TAG_OUT_OF_RANGE:
    pCVar12 = (ConversionException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&child_parameters,
               "One or more of the tags do not point to a valid union member",(allocator *)&tag_data
              );
    ConversionException::ConversionException(pCVar12,(string *)&child_parameters);
    __cxa_throw(pCVar12,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  default:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&child_parameters,"Struct to union cast failed for unknown reason",
               (allocator *)&tag_data);
    InternalException::InternalException(this_01,(string *)&child_parameters);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case VALIDITY_OVERLAP:
    pCVar12 = (ConversionException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&child_parameters,
               "One or more rows in the produced UNION have validity set for more than 1 member",
               (allocator *)&tag_data);
    ConversionException::ConversionException(pCVar12,(string *)&child_parameters);
    __cxa_throw(pCVar12,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  case TAG_MISMATCH:
    pCVar12 = (ConversionException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&child_parameters,
               "One or more rows in the produced UNION have tags that don\'t point to the valid member"
               ,(allocator *)&tag_data);
    ConversionException::ConversionException(pCVar12,(string *)&child_parameters);
    __cxa_throw(pCVar12,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  case NULL_TAG:
    pCVar12 = (ConversionException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&child_parameters,"One or more rows in the produced UNION have a NULL tag",
               (allocator *)&tag_data);
    ConversionException::ConversionException(pCVar12,(string *)&child_parameters);
    __cxa_throw(pCVar12,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  }
}

Assistant:

bool StructToUnionCast::Cast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &cast_data = parameters.cast_data->Cast<StructBoundCastData>();
	auto &lstate = parameters.local_state->Cast<StructCastLocalState>();

	D_ASSERT(source.GetType().id() == LogicalTypeId::STRUCT);
	D_ASSERT(result.GetType().id() == LogicalTypeId::UNION);
	D_ASSERT(cast_data.target.id() == LogicalTypeId::UNION);

	auto &source_children = StructVector::GetEntries(source);
	auto &target_children = StructVector::GetEntries(result);

	for (idx_t i = 0; i < source_children.size(); i++) {
		auto &result_child_vector = *target_children[i];
		auto &source_child_vector = *source_children[i];
		CastParameters child_parameters(parameters, cast_data.child_cast_info[i].cast_data, lstate.local_states[i]);
		auto converted =
		    cast_data.child_cast_info[i].function(source_child_vector, result_child_vector, count, child_parameters);
		(void)converted;
		D_ASSERT(converted);
		// we flatten the child because we use FlatVector::SetNull below and we may get non-flat from source/cast
		result_child_vector.Flatten(count);
	}

	if (source.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, ConstantVector::IsNull(source));

		// if the tag is NULL, the union should be NULL
		auto &tag_vec = *target_children[0];
		ConstantVector::SetNull(result, ConstantVector::IsNull(tag_vec));
	} else {
		// if the tag is NULL, the union should be NULL
		auto &tag_vec = *target_children[0];
		UnifiedVectorFormat source_data, tag_data;
		source.ToUnifiedFormat(count, source_data);
		tag_vec.ToUnifiedFormat(count, tag_data);

		for (idx_t i = 0; i < count; i++) {
			if (!source_data.validity.RowIsValid(source_data.sel->get_index(i)) ||
			    !tag_data.validity.RowIsValid(tag_data.sel->get_index(i))) {
				FlatVector::SetNull(result, i, true);
			}
		}
	}

	auto check_tags = UnionVector::CheckUnionValidity(result, count);
	switch (check_tags) {
	case UnionInvalidReason::TAG_OUT_OF_RANGE:
		throw ConversionException("One or more of the tags do not point to a valid union member");
	case UnionInvalidReason::VALIDITY_OVERLAP:
		throw ConversionException("One or more rows in the produced UNION have validity set for more than 1 member");
	case UnionInvalidReason::TAG_MISMATCH:
		throw ConversionException(
		    "One or more rows in the produced UNION have tags that don't point to the valid member");
	case UnionInvalidReason::NULL_TAG:
		throw ConversionException("One or more rows in the produced UNION have a NULL tag");
	case UnionInvalidReason::VALID:
		break;
	default:
		throw InternalException("Struct to union cast failed for unknown reason");
	}

	result.Verify(count);
	return true;
}